

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

gc_heap_ptr<mjs::date_object> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::date_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,float>
          (gc_heap *this,size_t num_bytes,string *args,gc_heap_ptr<mjs::object> *args_1,
          float *args_2)

{
  slot_allocation_header *psVar1;
  char *pcVar2;
  undefined8 extraout_RDX;
  slot *in_R9;
  allocation_result aVar3;
  gc_heap_ptr<mjs::date_object> gVar4;
  undefined1 local_48 [8];
  allocation_result a;
  float *args_local_2;
  gc_heap_ptr<mjs::object> *args_local_1;
  string *args_local;
  size_t num_bytes_local;
  gc_heap *this_local;
  
  a.obj = in_R9;
  aVar3 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  a._0_8_ = aVar3.obj;
  local_48._0_4_ = aVar3.pos;
  psVar1 = allocation_result::hdr((allocation_result *)local_48);
  if (psVar1->type == 0xffffffff) {
    pcVar2 = (char *)a._0_8_;
    gc_type_info_registration<mjs::date_object>::
    construct<mjs::string,mjs::gc_heap_ptr<mjs::object>,float>
              ((void *)a._0_8_,(string *)args_1,(gc_heap_ptr<mjs::object> *)args_2,
               (float *)&(a.obj)->new_position);
    pcVar2 = gc_type_info_registration<mjs::date_object>::index(pcVar2,(int)args_1);
    psVar1 = allocation_result::hdr((allocation_result *)local_48);
    psVar1->type = (uint32_t)pcVar2;
    gc_heap_ptr<mjs::date_object>::gc_heap_ptr
              ((gc_heap_ptr<mjs::date_object> *)this,(gc_heap *)num_bytes,local_48._0_4_);
    gVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar4.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::date_object>)gVar4.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::date_object, Args = <mjs::string, mjs::gc_heap_ptr<mjs::object>, float>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}